

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O2

void __thiscall
SigHashType_Constructor_GetSigHashFlag_Test::SigHashType_Constructor_GetSigHashFlag_Test
          (SigHashType_Constructor_GetSigHashFlag_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c55c8;
  return;
}

Assistant:

TEST(SigHashType, Constructor_GetSigHashFlag) {
  SigHashType type;
  SigHashType type2;
  EXPECT_NO_THROW(type = SigHashType());
  EXPECT_EQ(type.GetSigHashFlag(), 1);
  EXPECT_STREQ(type.ToString().c_str(), "ALL");

  EXPECT_NO_THROW(type2 = SigHashType(SigHashAlgorithm::kSigHashNone, true, false));
  EXPECT_EQ(type2.GetSigHashFlag(), 0x82);
  EXPECT_TRUE(type2.IsAnyoneCanPay());
  EXPECT_FALSE(type2.IsForkId());
  EXPECT_STREQ(type2.ToString().c_str(), "NONE|ANYONECANPAY");

  EXPECT_NO_THROW(type = type2);
  EXPECT_EQ(type.GetSigHashFlag(), 0x82);
}